

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  int cell_00;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  REF_INT found;
  REF_INT cell_nodes [4];
  REF_INT face;
  REF_INT face_nodes [4];
  int local_9c;
  int local_98;
  REF_INT local_94;
  ulong local_90;
  uint local_84;
  uint local_7c;
  ulong local_78;
  REF_INT local_6c;
  ulong local_68;
  int local_5c;
  REF_GRID local_58;
  REF_INT local_4c;
  REF_INT local_48 [3];
  int local_3c;
  
  ref_cell = ref_grid->cell[8];
  local_9c = -1;
  lVar7 = 0;
  lVar12 = 0;
  local_90 = CONCAT44(local_90._4_4_,0xffffffff);
  local_84 = 0xffffffff;
  local_7c = 0xffffffff;
  local_78 = CONCAT44(local_78._4_4_,0xffffffff);
  local_98 = -1;
  local_6c = cell;
  local_58 = ref_grid;
  do {
    pRVar1 = ref_cell->c2n;
    pRVar2 = ref_cell->f2n;
    lVar5 = 0;
    do {
      *(REF_INT *)((long)&local_68 + lVar5 * 4) =
           pRVar1[(long)ref_cell->size_per * (long)cell +
                  (long)*(int *)((long)pRVar2 + lVar5 * 4 + lVar7)];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    RVar3 = ref_cell_with(ref_grid->cell[3],(REF_INT *)&local_68,&local_94);
    if (RVar3 == 0) {
      uVar4 = ref_cell_nodes(ref_grid->cell[3],local_94,local_48);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x38
               ,"ref_swap_remove_two_face_cell",(ulong)uVar4,"tri");
        return uVar4;
      }
      ref_grid = local_58;
      if (local_9c == -1) {
        local_9c = local_94;
        local_98 = local_3c;
        local_84 = (uint)lVar12;
      }
      else {
        if ((int)local_90 != -1) {
          pcVar11 = "three or more faces detected";
          uVar4 = 3;
          uVar6 = 0x3f;
          uVar9 = 3;
          goto LAB_001fe075;
        }
        local_90 = CONCAT44(local_90._4_4_,local_94);
        local_78 = CONCAT44(local_78._4_4_,local_3c);
        local_7c = (uint)lVar12;
      }
    }
    lVar12 = lVar12 + 1;
    lVar7 = lVar7 + 0x10;
  } while (lVar12 != 4);
  uVar4 = 3;
  if (((local_9c != -1) && (cell_00 = (int)local_90, (int)local_90 != -1)) &&
     (local_98 == (int)local_78)) {
    uVar4 = ref_cell_remove(ref_grid->cell[3],local_9c);
    if (uVar4 == 0) {
      uVar4 = ref_cell_remove(ref_grid->cell[3],cell_00);
      if (uVar4 == 0) {
        uVar9 = (ulong)local_7c;
        uVar10 = (ulong)local_84;
        lVar7 = 0;
        uVar8 = 0;
        local_90 = uVar9;
        local_78 = uVar10;
        do {
          pRVar1 = ref_cell->c2n;
          pRVar2 = ref_cell->f2n;
          lVar12 = 0;
          do {
            *(REF_INT *)((long)&local_68 + lVar12 * 4) =
                 pRVar1[(long)ref_cell->size_per * (long)cell +
                        (long)*(int *)((long)pRVar2 + lVar12 * 4 + lVar7)];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          if (uVar8 != uVar9 && uVar8 != uVar10) {
            local_5c = local_98;
            local_68 = local_68 << 0x20 | local_68 >> 0x20;
            uVar4 = ref_cell_add(ref_grid->cell[3],(REF_INT *)&local_68,&local_4c);
            uVar9 = local_90;
            uVar10 = local_78;
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x57,"ref_swap_remove_two_face_cell",(ulong)uVar4,"add tri");
              return uVar4;
            }
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar8 != 4);
        uVar4 = ref_cell_remove(ref_cell,local_6c);
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          pcVar11 = "remove tet";
          uVar6 = 0x5b;
          uVar9 = (ulong)uVar4;
LAB_001fe075:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 uVar6,"ref_swap_remove_two_face_cell",uVar9,pcVar11);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x4d
               ,"ref_swap_remove_two_face_cell",(ulong)uVar4,"remove tri1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x4c,
             "ref_swap_remove_two_face_cell",(ulong)uVar4,"remove tri0");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,
                                                 REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1;
  REF_INT cell_face0, cell_face1;
  REF_INT faceid0, faceid1;
  REF_INT temp, face;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else {
        if (REF_EMPTY != face1) {
          RSS(REF_INVALID, "three or more faces detected");
        }
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (faceid0 != faceid1) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");

  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (cell_face != cell_face0 && cell_face != cell_face1) {
      cell_nodes[3] = faceid0;
      temp = cell_nodes[0];
      cell_nodes[0] = cell_nodes[1];
      cell_nodes[1] = temp;
      RSS(ref_cell_add(ref_grid_tri(ref_grid), cell_nodes, &face), "add tri");
    }
  }

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  return REF_SUCCESS;
}